

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O3

UINT8 device_start_saa1099_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  undefined1 auVar2 [16];
  UINT8 UVar3;
  saa1099_state *saa;
  DEV_DATA DVar4;
  long lVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  
  uVar1 = cfg->clock;
  uVar6 = uVar1 >> 7;
  if (cfg->srMode == '\x02') {
    if (uVar6 <= cfg->smplRate) {
      uVar6 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar6 = cfg->smplRate;
  }
  DVar4.chipInf = calloc(1,0x150);
  if (DVar4.chipInf == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(uint *)&((DEV_DATA *)((long)DVar4.chipInf + 0x148))->chipInf = uVar1;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x140))->chipInf = (void *)(double)uVar6;
    auVar2 = _DAT_001733d0;
    lVar5 = 0x69;
    auVar7 = _DAT_001733c0;
    do {
      if (SUB164(auVar7 ^ auVar2,4) == -0x80000000 && SUB164(auVar7 ^ auVar2,0) < -0x7ffffffa) {
        *(undefined1 *)((long)DVar4.chipInf + lVar5 + -0x28) = 0;
        *(undefined1 *)((long)DVar4.chipInf + lVar5) = 0;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x50;
    } while (lVar5 != 0x159);
    *(void **)DVar4.chipInf = DVar4.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = uVar6;
    retDevInf->devDef = &devDef_SAA1099_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_saa1099_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;	// /128 seems right based on the highest noise frequency
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099m_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_MAME);
	return 0x00;
}